

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void readDQT(FILE *f)

{
  uint uVar1;
  int local_34;
  char local_2d;
  int i_1;
  uchar s;
  int p;
  uchar t;
  int i;
  uchar id;
  uint precision;
  uchar c;
  FILE *pFStack_10;
  uint len;
  FILE *f_local;
  
  pFStack_10 = (FILE *)f;
  uVar1 = EnterNewSection(f,"DQT");
  for (precision = uVar1 - 2; precision != 0; precision = precision + i * -0x40) {
    fread(&id,1,1,pFStack_10);
    precision = precision - 1;
    i = 0x10;
    if ((int)(uint)id >> 4 == 0) {
      i = 8;
    }
    printf(anon_var_dwarf_3094,(ulong)(uint)i);
    i = (uint)i >> 3;
    t = id & 0xf;
    printf(anon_var_dwarf_30ab,(ulong)t);
    for (p = 0; p < 0x40; p = p + 1) {
      s = '\0';
      for (i_1 = 0; (uint)i_1 < (uint)i; i_1 = i_1 + 1) {
        fread(&local_2d,1,1,pFStack_10);
        s = s + local_2d;
      }
      quantTable[t][p] = (uint)s;
    }
    for (local_34 = 0; local_34 < 0x40; local_34 = local_34 + 1) {
      if (local_34 % 8 == 0) {
        printf("\n");
      }
      printf("%2d ",(ulong)(uint)quantTable[t][local_34]);
    }
    printf("\n");
  }
  return;
}

Assistant:

void readDQT(FILE *f) {
    unsigned int len = EnterNewSection(f, "DQT");
    len -= 2;
    while (len > 0) {
        unsigned char c;
        fread(&c, 1, 1, f);
        len--;
        unsigned precision = c >> 4 == 0 ? 8 : 16;
        printf("精度：%d\n", precision);
        precision /= 8;
        unsigned char id = c & 0x0F;
        printf("量化表ID: %d\n", id);
        for (int i = 0; i < 64; i++) {
            unsigned char t = 0;
            for (int p = 0; p < precision; p++) {
                unsigned char s;
                fread(&s, 1, 1, f);
                t == t << 8;
                t += s;
            }
            quantTable[id][i] = t;
        }
        for (int i = 0; i < 64; i++) {
            if (i % 8 == 0) {
                printf("\n");
            }
            printf("%2d ", quantTable[id][i]);
        }
        printf("\n");
        len -= (precision*64);
    }
}